

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

target_ulong pc_relative_pc(DisasContext_conflict6 *ctx)

{
  ulong uVar1;
  
  uVar1 = 0;
  if ((ctx->hflags & 0x87f800) != 0) {
    uVar1 = (ulong)(ctx->hflags >> 0xe & 2) | 0xfffffffffffffffc;
  }
  return uVar1 + (ctx->base).pc_next & 0xfffffffffffffffc;
}

Assistant:

static target_ulong pc_relative_pc(DisasContext *ctx)
{
    target_ulong pc = ctx->base.pc_next;

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        int branch_bytes = ctx->hflags & MIPS_HFLAG_BDS16 ? 2 : 4;

        pc -= branch_bytes;
    }

    pc &= ~(target_ulong)3;
    return pc;
}